

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O1

Matrix3x3 * __thiscall
CGL::Matrix3x3::operator*(Matrix3x3 *__return_storage_ptr__,Matrix3x3 *this,double c)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  Matrix3x3 *B;
  undefined8 uVar5;
  
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&__return_storage_ptr__->entries[0].field_0 + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->entries[0].field_0 + lVar4 + 0x10) = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x60);
  lVar4 = 0;
  do {
    uVar5 = 0x3ff0000000000000;
    if (lVar4 != 0) {
      uVar5 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[0].field_0 + lVar4) = uVar5;
    uVar5 = 0x3ff0000000000000;
    if (lVar4 != 8) {
      uVar5 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[1].field_0 + lVar4) = uVar5;
    uVar5 = 0x3ff0000000000000;
    if (lVar4 != 0x10) {
      uVar5 = 0;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->entries[2].field_0 + lVar4) = uVar5;
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x18);
  dVar2 = this->entries[0].field_0.field_0.z;
  dVar3 = this->entries[0].field_0.field_0.y;
  __return_storage_ptr__->entries[0].field_0.field_0.x = c * this->entries[0].field_0.field_0.x;
  __return_storage_ptr__->entries[0].field_0.field_0.y = c * dVar3;
  __return_storage_ptr__->entries[0].field_0.field_0.z = c * dVar2;
  dVar2 = this->entries[1].field_0.field_0.z;
  dVar3 = this->entries[1].field_0.field_0.y;
  __return_storage_ptr__->entries[1].field_0.field_0.x = c * this->entries[1].field_0.field_0.x;
  __return_storage_ptr__->entries[1].field_0.field_0.y = c * dVar3;
  __return_storage_ptr__->entries[1].field_0.field_0.z = c * dVar2;
  dVar2 = this->entries[2].field_0.field_0.z;
  dVar3 = this->entries[2].field_0.field_0.y;
  __return_storage_ptr__->entries[2].field_0.field_0.x = c * this->entries[2].field_0.field_0.x;
  __return_storage_ptr__->entries[2].field_0.field_0.y = c * dVar3;
  __return_storage_ptr__->entries[2].field_0.field_0.z = c * dVar2;
  return __return_storage_ptr__;
}

Assistant:

Matrix3x3 Matrix3x3::operator*( double c ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    B[0] = A[0] * c;
    B[1] = A[1] * c;
    B[2] = A[2] * c;

    return B;
  }